

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.h
# Opt level: O0

void __thiscall
cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
          (cmGeneratorExpressionInterpreter *this,cmLocalGenerator *localGenerator,string *config,
          cmGeneratorTarget *headTarget,string *lang)

{
  cmListFileBacktrace local_48;
  string *local_30;
  string *lang_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmLocalGenerator *localGenerator_local;
  cmGeneratorExpressionInterpreter *this_local;
  
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = lang;
  lang_local = (string *)headTarget;
  headTarget_local = (cmGeneratorTarget *)config;
  config_local = (string *)localGenerator;
  localGenerator_local = (cmLocalGenerator *)this;
  cmListFileBacktrace::cmListFileBacktrace(&local_48);
  cmGeneratorExpression::cmGeneratorExpression(&this->GeneratorExpression,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>
  ::unique_ptr<std::default_delete<cmCompiledGeneratorExpression>,void>
            ((unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>
              *)&this->CompiledGeneratorExpression);
  this->LocalGenerator = (cmLocalGenerator *)config_local;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  this->HeadTarget = (cmGeneratorTarget *)lang_local;
  std::__cxx11::string::string((string *)&this->Language,(string *)lang);
  return;
}

Assistant:

cmGeneratorExpressionInterpreter(cmLocalGenerator* localGenerator,
                                   std::string config,
                                   cmGeneratorTarget const* headTarget,
                                   std::string lang = std::string())
    : LocalGenerator(localGenerator)
    , Config(std::move(config))
    , HeadTarget(headTarget)
    , Language(std::move(lang))
  {
  }